

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O0

QStringList * __thiscall QInternalMimeData::formats(QInternalMimeData *this)

{
  QLatin1StringView str;
  bool bVar1;
  QList<QString> *this_00;
  qsizetype qVar2;
  long *in_RSI;
  QListSpecialMethods<QString> *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  int i;
  QStringList *realFormats;
  QStringList imageFormats;
  undefined4 in_stack_ffffffffffffff68;
  CaseSensitivity in_stack_ffffffffffffff6c;
  size_t in_stack_ffffffffffffff70;
  QListSpecialMethods<QString> *this_01;
  char *in_stack_ffffffffffffff88;
  int local_64;
  QList<QString> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(QString **)(in_RDI + 8) = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(in_RDI + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  (**(code **)(*in_RSI + 0x80))();
  latin1 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,in_stack_ffffffffffffff70);
  str.m_data = in_stack_ffffffffffffff88;
  str.m_size = (qsizetype)this_01;
  bVar1 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),str,
                     CaseInsensitive);
  if (!bVar1) {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    imageReadMimeFormats();
    local_64 = 0;
    while( true ) {
      this_00 = (QList<QString> *)(long)local_64;
      qVar2 = QList<QString>::size(&local_20);
      if (qVar2 <= (long)this_00) break;
      QList<QString>::at(this_00,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      bVar1 = QListSpecialMethods<QString>::contains
                        (in_RDI,(QString *)this_00,in_stack_ffffffffffffff6c);
      if (bVar1) {
        Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)this_00);
        QString::QString((QString *)this_01,latin1);
        QList<QString>::operator+=
                  (this_00,(rvalue_ref)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                  );
        QString::~QString((QString *)0x3a7232);
        break;
      }
      local_64 = local_64 + 1;
    }
    QList<QString>::~QList((QList<QString> *)0x3a7250);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QStringList *)in_RDI;
}

Assistant:

QStringList QInternalMimeData::formats() const
{
    QStringList realFormats = formats_sys();
    if (!realFormats.contains("application/x-qt-image"_L1)) {
        QStringList imageFormats = imageReadMimeFormats();
        for (int i = 0; i < imageFormats.size(); ++i) {
            if (realFormats.contains(imageFormats.at(i))) {
                realFormats += "application/x-qt-image"_L1;
                break;
            }
        }
    }
    return realFormats;
}